

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_menubar_begin(nk_context *ctx)

{
  nk_panel *pnVar1;
  nk_panel *layout;
  nk_context *ctx_local;
  
  if ((((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) &&
      (ctx->current->layout != (nk_panel *)0x0)) &&
     ((pnVar1 = ctx->current->layout, (pnVar1->flags & 0x2000) == 0 &&
      ((pnVar1->flags & 0x8000) == 0)))) {
    (pnVar1->menu).x = pnVar1->at_x;
    (pnVar1->menu).y = pnVar1->at_y + (pnVar1->row).height;
    (pnVar1->menu).w = (pnVar1->bounds).w;
    (pnVar1->menu).offset.x = *pnVar1->offset_x;
    (pnVar1->menu).offset.y = *pnVar1->offset_y;
    *pnVar1->offset_y = 0;
  }
  return;
}

Assistant:

NK_API void
nk_menubar_begin(struct nk_context *ctx)
{
struct nk_panel *layout;
NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return;

layout = ctx->current->layout;
NK_ASSERT(layout->at_y == layout->bounds.y);
/* if this assert triggers you allocated space between nk_begin and nk_menubar_begin.
    If you want a menubar the first nuklear function after `nk_begin` has to be a
    `nk_menubar_begin` call. Inside the menubar you then have to allocate space for
    widgets (also supports multiple rows).
    Example:
        if (nk_begin(...)) {
            nk_menubar_begin(...);
                nk_layout_xxxx(...);
                nk_button(...);
                nk_layout_xxxx(...);
                nk_button(...);
            nk_menubar_end(...);
        }
        nk_end(...);
    */
if (layout->flags & NK_WINDOW_HIDDEN || layout->flags & NK_WINDOW_MINIMIZED)
return;

layout->menu.x = layout->at_x;
layout->menu.y = layout->at_y + layout->row.height;
layout->menu.w = layout->bounds.w;
layout->menu.offset.x = *layout->offset_x;
layout->menu.offset.y = *layout->offset_y;
*layout->offset_y = 0;
}